

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O3

int Llb4_Nonlin4SweepCutpoints(Aig_Man_t *pAig,Vec_Int_t *vOrder,int nBddLimit,int fVerbose)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  uint uVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  DdManager *dd;
  DdNode *pDVar9;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  DdNode *g;
  DdNode *f;
  
  uVar8 = 0;
  dd = Cudd_Init(pAig->vObjs->nSize,0,0x100,0x40000,0);
  Aig_ManCleanData(pAig);
  pVVar10 = pAig->vCis;
  if (0 < pVVar10->nSize) {
    lVar11 = 0;
    do {
      pvVar5 = pVVar10->pArray[lVar11];
      iVar6 = *(int *)((long)pvVar5 + 0x24);
      if (((long)iVar6 < 0) || (vOrder->nSize <= iVar6)) goto LAB_008490de;
      pDVar9 = Cudd_bddIthVar(dd,vOrder->pArray[iVar6]);
      *(DdNode **)((long)pvVar5 + 0x28) = pDVar9;
      lVar11 = lVar11 + 1;
      pVVar10 = pAig->vCis;
    } while (lVar11 < pVVar10->nSize);
  }
  pVVar10 = pAig->vObjs;
  if (0 < pVVar10->nSize) {
    lVar11 = 0;
    uVar8 = 0;
    do {
      pvVar5 = pVVar10->pArray[lVar11];
      if ((pvVar5 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar5 + 0x18) & 7) - 7)) {
        f = (DdNode *)
            ((ulong)((uint)*(ulong *)((long)pvVar5 + 8) & 1) ^
            *(ulong *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x28));
        g = (DdNode *)
            ((ulong)((uint)*(ulong *)((long)pvVar5 + 0x10) & 1) ^
            *(ulong *)((*(ulong *)((long)pvVar5 + 0x10) & 0xfffffffffffffffe) + 0x28));
        pDVar9 = Cudd_bddAnd(dd,f,g);
        Cudd_Ref(pDVar9);
        iVar6 = Cudd_DagSize(pDVar9);
        if (nBddLimit < iVar6) {
          puVar1 = (ulong *)((long)pvVar5 + 8);
          puVar2 = (ulong *)((long)pvVar5 + 0x10);
          Cudd_RecursiveDeref(dd,pDVar9);
          iVar6 = Cudd_DagSize(f);
          iVar7 = Cudd_DagSize(g);
          if (iVar6 < iVar7) {
            Cudd_RecursiveDeref(dd,*(DdNode **)((*puVar2 & 0xfffffffffffffffe) + 0x28));
            uVar4 = *(uint *)((*puVar2 & 0xfffffffffffffffe) + 0x24);
            puVar3 = puVar2;
          }
          else {
            Cudd_RecursiveDeref(dd,*(DdNode **)((*puVar1 & 0xfffffffffffffffe) + 0x28));
            uVar4 = *(uint *)((*puVar1 & 0xfffffffffffffffe) + 0x24);
            puVar3 = puVar1;
          }
          if (((int)uVar4 < 0) || (vOrder->nSize <= (int)uVar4)) {
LAB_008490de:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pDVar9 = Cudd_bddIthVar(dd,vOrder->pArray[uVar4]);
          *(DdNode **)((*puVar3 & 0xfffffffffffffffe) + 0x28) = pDVar9;
          Cudd_Ref(pDVar9);
          puVar3 = (ulong *)((*puVar3 & 0xfffffffffffffffe) + 0x18);
          *puVar3 = *puVar3 | 0x10;
          pDVar9 = Cudd_bddAnd(dd,(DdNode *)
                                  ((ulong)((uint)*puVar1 & 1) ^
                                  *(ulong *)((*puVar1 & 0xfffffffffffffffe) + 0x28)),
                               (DdNode *)
                               ((ulong)((uint)*puVar2 & 1) ^
                               *(ulong *)((*puVar2 & 0xfffffffffffffffe) + 0x28)));
          Cudd_Ref(pDVar9);
          uVar8 = uVar8 + 1;
        }
        *(DdNode **)((long)pvVar5 + 0x28) = pDVar9;
        pVVar10 = pAig->vObjs;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar10->nSize);
    if (0 < pVVar10->nSize) {
      lVar11 = 0;
      do {
        pvVar5 = pVVar10->pArray[lVar11];
        if ((pvVar5 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar5 + 0x18) & 7) - 7)) {
          Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar5 + 0x28));
          pVVar10 = pAig->vObjs;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar10->nSize);
    }
  }
  Extra_StopManager(dd);
  if (fVerbose != 0) {
    printf("Added %d cut points.  Used %d high fanout points.\n",(ulong)uVar8,0);
  }
  return uVar8;
}

Assistant:

int Llb4_Nonlin4SweepCutpoints( Aig_Man_t * pAig, Vec_Int_t * vOrder, int nBddLimit, int fVerbose )
{
    DdManager * dd;
    DdNode * bFunc0, * bFunc1, * bFunc;
    Aig_Obj_t * pObj;
    int i, Counter = 0, Counter1 = 0;
    dd = Cudd_Init( Aig_ManObjNumMax(pAig), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    // assign elementary variables
    Aig_ManCleanData( pAig );
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
    // sweep internal nodes
    Aig_ManForEachNode( pAig, pObj, i )
    {
/*
        if ( pObj->nRefs >= 4 )
        {
            bFunc = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );  Cudd_Ref( bFunc );
            pObj->pData = bFunc;
            Counter1++;
            continue;
        }
*/
        bFunc0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bFunc1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
        bFunc  = Cudd_bddAnd( dd, bFunc0, bFunc1 );  Cudd_Ref( bFunc );
        if ( Cudd_DagSize(bFunc) > nBddLimit )
        {
//            if ( fVerbose )
//                printf( "Node %5d : Beg =%5d. ", i, Cudd_DagSize(bFunc) );

            // add cutpoint at a larger one
            Cudd_RecursiveDeref( dd, bFunc );
            if ( Cudd_DagSize(bFunc0) >= Cudd_DagSize(bFunc1) )
            {
                Cudd_RecursiveDeref( dd, (DdNode *)Aig_ObjFanin0(pObj)->pData );
                bFunc = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, Aig_ObjFanin0(pObj)) );
                Aig_ObjFanin0(pObj)->pData = bFunc;  Cudd_Ref( bFunc );
                Aig_ObjFanin0(pObj)->fMarkA = 1;

//                if ( fVerbose )
//                    printf( "Ref =%3d  ", Aig_ObjFanin0(pObj)->nRefs );
            }
            else
            {
                Cudd_RecursiveDeref( dd, (DdNode *)Aig_ObjFanin1(pObj)->pData );
                bFunc = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, Aig_ObjFanin1(pObj)) );
                Aig_ObjFanin1(pObj)->pData = bFunc;  Cudd_Ref( bFunc );
                Aig_ObjFanin1(pObj)->fMarkA = 1;

//                if ( fVerbose )
//                    printf( "Ref =%3d  ", Aig_ObjFanin1(pObj)->nRefs );
            }
            // perform new operation
            bFunc0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
            bFunc1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
            bFunc  = Cudd_bddAnd( dd, bFunc0, bFunc1 );  Cudd_Ref( bFunc );
//            assert( Cudd_DagSize(bFunc) <= nBddLimit );

//            if ( fVerbose )
//                printf( "End =%5d.\n", Cudd_DagSize(bFunc) );
            Counter++;
        }
        pObj->pData = bFunc;
//printf( "%d ", Cudd_DagSize(bFunc) );
    }
//printf( "\n" );
    // clean up
    Aig_ManForEachNode( pAig, pObj, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    Extra_StopManager( dd );
//    Aig_ManCleanMarkA( pAig );
    if ( fVerbose )
    printf( "Added %d cut points.  Used %d high fanout points.\n", Counter, Counter1 );
    return Counter + Counter1;
}